

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

uint64_t Catch::anon_unknown_1::estimateClockResolution(void)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  bVar7 = false;
  uVar5 = 0;
  uVar6 = 0;
  while( true ) {
    lVar2 = std::chrono::_V2::system_clock::now();
    do {
      uVar3 = std::chrono::_V2::system_clock::now();
    } while (uVar3 - lVar2 == 0);
    uVar5 = uVar5 + (uVar3 - lVar2);
    uVar4 = uVar6 + 1;
    if (lVar1 + 3000000000U < uVar3) break;
    bVar7 = 0xf423e < uVar6;
    uVar6 = uVar4;
    if (uVar4 == 1000000) {
      uVar4 = 1000000;
LAB_0016a8e5:
      return uVar5 / uVar4;
    }
  }
  if (bVar7) {
    uVar4 = 1000000;
  }
  goto LAB_0016a8e5;
}

Assistant:

auto getCurrentNanosecondsSinceEpoch() -> uint64_t {
        return std::chrono::duration_cast<std::chrono::nanoseconds>( std::chrono::high_resolution_clock::now().time_since_epoch() ).count();
    }